

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O3

Vec_Ptr_t * Aig_ManReduceLachesOnce(Aig_Man_t *p)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  int iVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  size_t __size;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong local_50;
  ulong local_48;
  
  uVar3 = p->nObjs[2];
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar17 = 8;
  if (6 < uVar3 - 1) {
    uVar17 = (ulong)uVar3;
  }
  pVVar4->nSize = 0;
  iVar13 = (int)uVar17;
  pVVar4->nCap = iVar13;
  uVar14 = 0;
  if (iVar13 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar13 << 3);
  }
  pVVar4->pArray = ppvVar5;
  uVar15 = (ulong)(uint)p->nRegs;
  if (p->nRegs < (int)uVar3) {
    uVar18 = 0;
    do {
      if ((long)p->vCis->nSize <= (long)uVar18) goto LAB_006d1bdd;
      pvVar6 = p->vCis->pArray[uVar18];
      iVar13 = (int)uVar17;
      if ((int)uVar18 == iVar13) {
        if (iVar13 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
          uVar17 = 0x10;
        }
        else {
          uVar17 = (ulong)(uint)(iVar13 * 2);
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar17 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,uVar17 * 8);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar13 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      uVar14 = uVar18 + 1;
      pVVar4->nSize = (int)uVar14;
      ppvVar5[uVar18] = pvVar6;
      uVar15 = (ulong)p->nRegs;
      uVar18 = uVar14;
    } while ((long)uVar14 < (long)((long)p->nObjs[2] - uVar15));
  }
  __size = (long)p->vObjs->nSize << 3;
  pvVar6 = malloc(__size);
  memset(pvVar6,0xff,__size);
  uVar3 = (uint)uVar15;
  if ((int)uVar3 < 1) {
    if (pvVar6 == (void *)0x0) goto LAB_006d1b95;
  }
  else {
    iVar13 = (int)uVar14;
    lVar10 = 0;
    uVar18 = uVar17;
    local_50 = uVar17;
    local_48 = uVar17;
    do {
      uVar8 = (ulong)(uint)(p->nObjs[3] - (int)uVar15) + lVar10;
      iVar7 = (int)uVar8;
      if ((iVar7 < 0) || (p->vCos->nSize <= iVar7)) goto LAB_006d1bdd;
      uVar3 = p->nObjs[2] - (int)uVar15;
      iVar7 = (int)((ulong)uVar3 + lVar10);
      if (iVar7 < 0) goto LAB_006d1bdd;
      uVar2 = p->vCis->nSize;
      if ((int)uVar2 <= iVar7) goto LAB_006d1bdd;
      ppvVar5 = p->vCis->pArray;
      pvVar16 = ppvVar5[(ulong)uVar3 + lVar10 & 0xffffffff];
      uVar15 = *(ulong *)((long)p->vCos->pArray[uVar8 & 0xffffffff] + 8);
      uVar11 = uVar15 & 0xfffffffffffffffe;
      uVar8 = *(ulong *)(uVar11 + 0x18);
      iVar7 = (int)uVar14;
      if ((uVar15 & 1) == 0) {
        if ((uVar8 & 0x10) == 0) {
          *(ulong *)(uVar11 + 0x18) = uVar8 | 0x10;
          *(int *)((long)pvVar6 + (long)*(int *)(uVar11 + 0x24) * 8) = (int)lVar10;
          iVar12 = (int)uVar18;
          if (iVar7 == iVar12) {
            if (iVar12 < 0x10) goto LAB_006d1a1d;
            uVar3 = iVar12 * 2;
            uVar18 = (ulong)uVar3;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar18 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,uVar18 * 8);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = uVar3;
            uVar17 = (ulong)uVar3;
            local_50 = uVar17;
            local_48 = uVar17;
          }
          else {
            ppvVar5 = pVVar4->pArray;
            uVar17 = uVar18;
            local_50 = uVar18;
            local_48 = uVar18;
          }
        }
        else {
          uVar3 = uVar3 + *(int *)((long)pvVar6 + (long)*(int *)(uVar11 + 0x24) * 8);
          if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_006d1bdd;
          pvVar16 = ppvVar5[uVar3];
          iVar12 = (int)local_48;
          if (iVar7 == iVar12) {
            if (iVar12 < 0x10) goto LAB_006d1a1d;
            uVar3 = iVar12 * 2;
            uVar17 = (ulong)uVar3;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar17 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,uVar17 * 8);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = uVar3;
LAB_006d1b31:
            uVar18 = (ulong)uVar3;
            local_50 = uVar17;
            local_48 = uVar17;
          }
          else {
            ppvVar5 = pVVar4->pArray;
            local_50 = local_48;
            uVar17 = local_48;
          }
        }
      }
      else if ((uVar8 & 0x20) == 0) {
        *(ulong *)(uVar11 + 0x18) = uVar8 | 0x20;
        *(int *)((long)pvVar6 + (long)*(int *)(uVar11 + 0x24) * 8 + 4) = (int)lVar10;
        iVar12 = (int)local_50;
        if (iVar7 == iVar12) {
          if (0xf < iVar12) {
            uVar3 = iVar12 * 2;
            uVar17 = (ulong)uVar3;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar17 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,uVar17 * 8);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = uVar3;
            goto LAB_006d1b31;
          }
LAB_006d1a1d:
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
          uVar18 = 0x10;
          local_48 = 0x10;
          uVar17 = local_48;
          local_50 = local_48;
        }
        else {
          ppvVar5 = pVVar4->pArray;
          uVar17 = local_50;
        }
      }
      else {
        uVar3 = uVar3 + *(int *)((long)pvVar6 + (long)*(int *)(uVar11 + 0x24) * 8 + 4);
        if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_006d1bdd;
        pvVar16 = ppvVar5[uVar3];
        iVar12 = (int)uVar17;
        if (iVar7 == iVar12) {
          if (iVar12 < 0x10) goto LAB_006d1a1d;
          uVar3 = iVar12 * 2;
          uVar17 = (ulong)uVar3;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar17 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,uVar17 * 8);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar3;
          uVar18 = (ulong)uVar3;
          local_50 = uVar17;
          local_48 = uVar17;
        }
        else {
          ppvVar5 = pVVar4->pArray;
        }
      }
      uVar14 = (ulong)(iVar7 + 1U);
      pVVar4->nSize = iVar7 + 1U;
      ppvVar5[iVar13 + lVar10] = pvVar16;
      uVar3 = p->nRegs;
      uVar15 = (ulong)uVar3;
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 < (int)uVar3);
  }
  free(pvVar6);
LAB_006d1b95:
  uVar3 = p->nObjs[3] - uVar3;
  pVVar9 = p->vCos;
  if ((int)uVar3 < pVVar9->nSize) {
    uVar17 = (ulong)uVar3;
    do {
      if ((int)uVar3 < 0) {
LAB_006d1bdd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((*(ulong *)((long)pVVar9->pArray[uVar17] + 8) & 0xfffffffffffffffe) + 0x18)
      ;
      *puVar1 = *puVar1 & 0xffffffffffffffcf;
      uVar17 = uVar17 + 1;
      pVVar9 = p->vCos;
    } while ((int)uVar17 < pVVar9->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManReduceLachesOnce( Aig_Man_t * p )
{
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pFanin;
    int * pMapping, i;
    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // create mapping of fanin nodes into the corresponding latch outputs
    pMapping = ABC_FALLOC( int, 2 * Aig_ManObjNumMax(p) );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pFanin = Aig_ObjFanin0(pObjLi);
        if ( Aig_ObjFaninC0(pObjLi) )
        {
            if ( pFanin->fMarkB )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id + 1]) );
            }
            else
            {
                pFanin->fMarkB = 1;
                pMapping[2*pFanin->Id + 1] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
        else
        {
            if ( pFanin->fMarkA )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id]) );
            }
            else
            {
                pFanin->fMarkA = 1;
                pMapping[2*pFanin->Id] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
    }
    ABC_FREE( pMapping );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vMap;
}